

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_c
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  char cVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int m_3;
  int32_t res_3;
  int m_2;
  int32_t res_2;
  int m_1;
  int32_t res_1;
  int m;
  int32_t res;
  int round_bits;
  int round_offset;
  int offset_bits;
  int bd;
  int j;
  int i;
  undefined4 local_34;
  undefined4 local_30;
  
  cVar1 = '\x16' - (char)*(undefined4 *)(CONCAT44(src1_stride,i) + 0x14);
  iVar3 = (1 << (cVar1 - (char)*(undefined4 *)(CONCAT44(src1_stride,i) + 0x18) & 0x1fU)) +
          (1 << ((cVar1 - (char)*(undefined4 *)(CONCAT44(src1_stride,i) + 0x18)) - 1U & 0x1f));
  bVar6 = ('\x0e' - (char)*(undefined4 *)(CONCAT44(src1_stride,i) + 0x14)) -
          (char)*(undefined4 *)(CONCAT44(src1_stride,i) + 0x18);
  if ((round_offset == 0) && (bd == 0)) {
    for (local_30 = 0; local_30 < res; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < res_1; local_34 = local_34 + 1) {
        uVar4 = (uint)*(byte *)(_res_3 + (ulong)(uint)(local_30 * res_2 + local_34));
        uVar2 = clip_pixel((((int)(uVar4 * *(ushort *)
                                            (in_RDX + (ulong)(uint)(local_30 * in_ECX + local_34) *
                                                      2) +
                                  (0x40 - uVar4) *
                                  (uint)*(ushort *)
                                         (in_R8 + (ulong)(uint)(local_30 * in_R9D + local_34) * 2))
                            >> 6) - iVar3) + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f));
        *(uint8_t *)(in_RDI + (ulong)(uint)(local_30 * in_ESI + local_34)) = uVar2;
      }
    }
  }
  else if ((round_offset == 1) && (bd == 1)) {
    for (local_30 = 0; local_30 < res; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < res_1; local_34 = local_34 + 1) {
        iVar5 = (int)((uint)*(byte *)(_res_3 + (ulong)(uint)(local_30 * 2 * res_2 + local_34 * 2)) +
                      (uint)*(byte *)(_res_3 + (ulong)(uint)((local_30 * 2 + 1) * res_2 +
                                                            local_34 * 2)) +
                      (uint)*(byte *)(_res_3 + (ulong)(uint)(local_30 * 2 * res_2 + local_34 * 2 + 1
                                                            )) +
                      (uint)*(byte *)(_res_3 + (ulong)(uint)((local_30 * 2 + 1) * res_2 +
                                                            local_34 * 2 + 1)) + 2) >> 2;
        uVar2 = clip_pixel((((int)(iVar5 * (uint)*(ushort *)
                                                  (in_RDX + (ulong)(uint)(local_30 * in_ECX +
                                                                         local_34) * 2) +
                                  (0x40 - iVar5) *
                                  (uint)*(ushort *)
                                         (in_R8 + (ulong)(uint)(local_30 * in_R9D + local_34) * 2))
                            >> 6) - iVar3) + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f));
        *(uint8_t *)(in_RDI + (ulong)(uint)(local_30 * in_ESI + local_34)) = uVar2;
      }
    }
  }
  else if ((round_offset == 1) && (bd == 0)) {
    for (local_30 = 0; local_30 < res; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < res_1; local_34 = local_34 + 1) {
        iVar5 = (int)((uint)*(byte *)(_res_3 + (ulong)(uint)(local_30 * res_2 + local_34 * 2)) +
                      (uint)*(byte *)(_res_3 + (ulong)(uint)(local_30 * res_2 + local_34 * 2 + 1)) +
                     1) >> 1;
        uVar2 = clip_pixel((((int)(iVar5 * (uint)*(ushort *)
                                                  (in_RDX + (ulong)(uint)(local_30 * in_ECX +
                                                                         local_34) * 2) +
                                  (0x40 - iVar5) *
                                  (uint)*(ushort *)
                                         (in_R8 + (ulong)(uint)(local_30 * in_R9D + local_34) * 2))
                            >> 6) - iVar3) + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f));
        *(uint8_t *)(in_RDI + (ulong)(uint)(local_30 * in_ESI + local_34)) = uVar2;
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < res; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < res_1; local_34 = local_34 + 1) {
        iVar5 = (int)((uint)*(byte *)(_res_3 + (ulong)(uint)(local_30 * 2 * res_2 + local_34)) +
                      (uint)*(byte *)(_res_3 + (ulong)(uint)((local_30 * 2 + 1) * res_2 + local_34))
                     + 1) >> 1;
        uVar2 = clip_pixel((((int)(iVar5 * (uint)*(ushort *)
                                                  (in_RDX + (ulong)(uint)(local_30 * in_ECX +
                                                                         local_34) * 2) +
                                  (0x40 - iVar5) *
                                  (uint)*(ushort *)
                                         (in_R8 + (ulong)(uint)(local_30 * in_R9D + local_34) * 2))
                            >> 6) - iVar3) + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f));
        *(uint8_t *)(in_RDI + (ulong)(uint)(local_30 * in_ESI + local_34)) = uVar2;
      }
    }
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_c(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  int i, j;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = mask[i * mask_stride + j];
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        res = ((int32_t)(m * (int32_t)src0[i * src0_stride + j] +
                         (AOM_BLEND_A64_MAX_ALPHA - m) *
                             (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  }
}